

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O0

int Dau_DsdToGia2_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover
                     )

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int local_330;
  int nVars_1;
  int i;
  int Res_3;
  int Fanins_1 [12];
  word pFunc [64];
  char *q_4;
  Vec_Int_t vLeaves;
  char *q_3;
  char *q2;
  char *q_2;
  char *pOld;
  int *pLits2;
  int Fanins [12];
  int **ppiStack_80;
  int Res_2;
  int *pTemp;
  int Temp [3];
  int nVars;
  int Lit_1;
  int Res_1;
  char *q_1;
  int Lit;
  int Res;
  char *q;
  int fCompl;
  Vec_Int_t *vCover_local;
  int *pLits_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  Gia_Man_t *pGia_local;
  
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  q._4_4_ = (uint)(cVar1 == '!');
  if ((**p < 'a') || ('l' < **p)) {
    if (**p == '(') {
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      q_1._4_4_ = 1;
      if ((**p != '(') || (*pcVar4 != ')')) {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,99,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      *p = *p + 1;
      while (*p < pcVar4) {
        iVar2 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        q_1._4_4_ = Gia_ManHashAnd(pGia,q_1._4_4_,iVar2);
        *p = *p + 1;
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0x69,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pGia_local._4_4_ = Abc_LitNotCond(q_1._4_4_,q._4_4_);
    }
    else if (**p == '[') {
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      nVars = 0;
      if ((**p != '[') || (*pcVar4 != ']')) {
        __assert_fail("**p == \'[\' && *q == \']\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0x70,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      *p = *p + 1;
      while (*p < pcVar4) {
        Temp[2] = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        if (pGia->pMuxes == (uint *)0x0) {
          nVars = Gia_ManHashXor(pGia,nVars,Temp[2]);
        }
        else {
          nVars = Gia_ManHashXorReal(pGia,nVars,Temp[2]);
        }
        *p = *p + 1;
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0x79,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pGia_local._4_4_ = Abc_LitNotCond(nVars,q._4_4_);
    }
    else if (**p == '<') {
      Temp[1] = 0;
      q_2 = *p;
      pOld = (char *)pLits;
      if (pStr[(long)pMatches[(long)*p - (long)pStr] + 1] == '{') {
        *p = pStr + (long)pMatches[(long)*p - (long)pStr] + 1;
        pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
        if ((**p != '{') || (*pcVar4 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                        ,0x89,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        Temp[1] = 0;
        *p = *p + 1;
        while (*p < pcVar4) {
          iVar2 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
          Fanins[(long)Temp[1] + -2] = iVar2;
          *p = *p + 1;
          Temp[1] = Temp[1] + 1;
        }
        if (*p != pcVar4) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                        ,0x8c,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pOld = (char *)&pLits2;
      }
      *p = q_2;
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '<') || (*pcVar4 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0x94,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (Temp[1] != 0) {
        for (; q_2 < pcVar4; q_2 = q_2 + 1) {
          if ((('`' < *q_2) && (*q_2 < '{')) && (Temp[1] <= *q_2 + -0x61)) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                          ,0x99,
                          "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
        }
      }
      *p = *p + 1;
      ppiStack_80 = &pTemp;
      while (*p < pcVar4) {
        iVar2 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,(int *)pOld,vCover);
        *(int *)ppiStack_80 = iVar2;
        *p = *p + 1;
        ppiStack_80 = (int **)((long)ppiStack_80 + 4);
      }
      if (ppiStack_80 != (int **)(Temp + 1)) {
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0x9d,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0x9e,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar4[1] == '{') {
        pcVar4 = *p;
        *p = pcVar4 + 1;
        vLeaves.pArray = (int *)(pStr + pMatches[(long)(pcVar4 + 1) - (long)pStr]);
        if ((**p != '{') || ((char)*vLeaves.pArray != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                        ,0xa2,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        *p = (char *)vLeaves.pArray;
      }
      if (pGia->pMuxes == (uint *)0x0) {
        Fanins[0xb] = Gia_ManHashMux(pGia,(int)pTemp,pTemp._4_4_,Temp[0]);
      }
      else {
        Fanins[0xb] = Gia_ManHashMuxReal(pGia,(int)pTemp,pTemp._4_4_,Temp[0]);
      }
      pGia_local._4_4_ = Abc_LitNotCond(Fanins[0xb],q._4_4_);
    }
    else {
      if (((**p < 'A') || ('F' < **p)) && ((**p < '0' || ('9' < **p)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0xc0,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      iVar2 = Abc_TtReadHex((word *)(Fanins_1 + 10),*p);
      iVar3 = Abc_TtHexDigitNum(iVar2);
      *p = *p + iVar3;
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '{') || (*pcVar4 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0xb3,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      local_330 = 0;
      *p = *p + 1;
      while (*p < pcVar4) {
        iVar3 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        (&i)[local_330] = iVar3;
        *p = *p + 1;
        local_330 = local_330 + 1;
      }
      if (local_330 != iVar2) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0xb6,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                      ,0xb7,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      vLeaves._0_8_ = &i;
      q_4._0_4_ = iVar2;
      q_4._4_4_ = iVar2;
      iVar2 = Kit_TruthToGia(pGia,(uint *)(Fanins_1 + 10),iVar2,vCover,(Vec_Int_t *)&q_4,1);
      m_Non1Step = m_Non1Step + 1;
      pGia_local._4_4_ = Abc_LitNotCond(iVar2,q._4_4_);
    }
  }
  else {
    pGia_local._4_4_ = Abc_LitNotCond(pLits[**p + -0x61],q._4_4_);
  }
  return pGia_local._4_4_;
}

Assistant:

int Dau_DsdToGia2_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 1, Lit;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Res = Gia_ManHashAnd( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 0, Lit;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            if ( pGia->pMuxes )
                Res = Gia_ManHashXorReal( pGia, Res, Lit );
            else
                Res = Gia_ManHashXor( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
//        Res = Dau_DsdToGia2Compose_rec( pGia, Func, Fanins, nVars );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;        
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}